

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<float>_>::Subst_Diag(TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *B)

{
  long lVar1;
  long lVar2;
  Fad<float> *v;
  Fad<float> *pFVar3;
  long lVar4;
  int64_t iVar5;
  TPZBaseMatrix *in_RSI;
  Fad<float> *in_RDI;
  int64_t c;
  Fad<float> pivot;
  int64_t r;
  char *in_stack_00000118;
  char *in_stack_00000120;
  TPZBaseMatrix *in_stack_ffffffffffffff20;
  Fad<float> *in_stack_ffffffffffffff60;
  undefined1 local_70 [48];
  long local_40;
  undefined1 local_38 [32];
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  v = (Fad<float> *)TPZBaseMatrix::Rows(in_RSI);
  pFVar3 = (Fad<float> *)(**(code **)(*(long *)in_RDI + 0x60))();
  if (v != pFVar3) {
    Error(in_stack_00000120,in_stack_00000118);
  }
  local_18 = 0;
  while( true ) {
    lVar1 = local_18;
    lVar4 = (**(code **)(*(long *)in_RDI + 0x60))();
    if (lVar4 <= lVar1) break;
    (**(code **)(*(long *)in_RDI + 0x120))(local_38,in_RDI,local_18,local_18);
    local_40 = 0;
    while( true ) {
      lVar1 = local_40;
      iVar5 = TPZBaseMatrix::Cols(local_10);
      lVar2 = local_18;
      lVar4 = local_40;
      if (iVar5 <= lVar1) break;
      in_stack_ffffffffffffff20 = local_10;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(&stack0xffffffffffffff60);
      operator/<Fad<float>,_Fad<float>,_nullptr>(v,in_RDI);
      Fad<float>::Fad<FadBinaryDiv<Fad<float>,Fad<float>>>
                (in_stack_ffffffffffffff60,(FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *)v);
      (*(in_stack_ffffffffffffff20->super_TPZSavable)._vptr_TPZSavable[0x23])
                (in_stack_ffffffffffffff20,lVar2,lVar4,local_70);
      Fad<float>::~Fad((Fad<float> *)in_stack_ffffffffffffff20);
      FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_>::~FadExpr
                ((FadExpr<FadBinaryDiv<Fad<float>,_Fad<float>_>_> *)in_stack_ffffffffffffff20);
      Fad<float>::~Fad((Fad<float> *)in_stack_ffffffffffffff20);
      local_40 = local_40 + 1;
    }
    Fad<float>::~Fad((Fad<float> *)in_stack_ffffffffffffff20);
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != Dim())) {
        Error("TPZMatrix::Subst_Diag incompatible dimensions\n");
	}
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			B->PutVal( r, c, B->GetVal( r, c ) / pivot );
		}
	}
	return( 1 );
}